

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::claDecayActivity(SAT *this)

{
  uint uVar1;
  Clause **ppCVar2;
  Clause *pCVar3;
  uint i;
  ulong uVar4;
  double dVar5;
  
  dVar5 = this->cla_inc * 1.001;
  this->cla_inc = dVar5;
  if (1e+20 < dVar5) {
    this->cla_inc = dVar5 * 1e-20;
    uVar1 = (this->learnts).sz;
    ppCVar2 = (this->learnts).data;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      pCVar3 = ppCVar2[uVar4];
      pCVar3->data[*(uint *)pCVar3 >> 8].x =
           (int)((float)pCVar3->data[*(uint *)pCVar3 >> 8].x * 1e-20);
    }
  }
  return;
}

Assistant:

inline void SAT::claDecayActivity() {
	// Increase the increment by 0.1%.  This introduces "activity
	// inflation", making all previous activity counts have less value.
	cla_inc *= 1.001;
	// If inflation has become too much, normalise all the activity
	// counts by scaling everything down by a factor of 1e20.
	if (cla_inc > 1e20) {
		cla_inc *= 1e-20;
		for (unsigned int i = 0; i < learnts.size(); i++) {
			learnts[i]->activity() *= 1e-20F;
		}
	}
}